

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O1

void __thiscall
OpenMD::ReplacementVisitor::ReplacementVisitor(ReplacementVisitor *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  AtomData *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  AtomData *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  BaseAtomVisitor::BaseAtomVisitor(&this->super_BaseAtomVisitor,info);
  (this->super_BaseAtomVisitor).super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_002bf4d0;
  p_Var1 = &(this->myTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->myTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->myTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->myTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->myTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->myTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseAtomVisitor).super_BaseVisitor.visitorName,0,
             (char *)(this->super_BaseAtomVisitor).super_BaseVisitor.visitorName._M_string_length,
             0x25b16a);
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
            (&_Stack_20,&local_28,(allocator<OpenMD::AtomData> *)&local_29);
  _Var3._M_pi = _Stack_20._M_pi;
  pAVar2 = local_28;
  local_28 = (AtomData *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar2;
  (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return;
}

Assistant:

ReplacementVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "ReplacementVisitor";
      sites_      = std::make_shared<AtomData>();
    }